

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall
mkvparser::Cues::Find(Cues *this,longlong time_ns,Track *pTrack,CuePoint **pCP,TrackPosition **pTP)

{
  CuePoint **ppCVar1;
  undefined1 auVar2 [16];
  CuePoint **ppCVar3;
  longlong lVar4;
  TrackPosition *pTVar5;
  CuePoint **ppCVar6;
  longlong t;
  CuePoint *pCP_1;
  CuePoint **k;
  CuePoint **j;
  CuePoint **jj;
  CuePoint **i;
  CuePoint **ii;
  TrackPosition **pTP_local;
  CuePoint **pCP_local;
  Track *pTrack_local;
  longlong time_ns_local;
  Cues *this_local;
  
  if ((((time_ns < 0) || (pTrack == (Track *)0x0)) || (this->m_cue_points == (CuePoint **)0x0)) ||
     (this->m_count == 0)) {
    this_local._7_1_ = false;
  }
  else {
    ppCVar1 = this->m_cue_points;
    ppCVar3 = ppCVar1 + this->m_count;
    *pCP = *ppCVar1;
    if (*pCP == (CuePoint *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      lVar4 = CuePoint::GetTime(*pCP,this->m_pSegment);
      k = ppCVar3;
      jj = ppCVar1;
      if (lVar4 < time_ns) {
        do {
          if (k <= jj) {
            if (((jj == k) && (jj <= ppCVar3)) && (ppCVar1 < jj)) {
              *pCP = jj[-1];
              if ((*pCP != (CuePoint *)0x0) &&
                 (lVar4 = CuePoint::GetTime(*pCP,this->m_pSegment), lVar4 <= time_ns)) {
                pTVar5 = CuePoint::Find(*pCP,pTrack);
                *pTP = pTVar5;
                return *pTP != (TrackPosition *)0x0;
              }
              return false;
            }
            return false;
          }
          auVar2._8_8_ = (long)k - (long)jj >> 0x3f;
          auVar2._0_8_ = (long)k - (long)jj >> 3;
          ppCVar6 = jj + SUB168(auVar2 / SEXT816(2),0);
          if (ppCVar3 <= ppCVar6) {
            return false;
          }
          if (*ppCVar6 == (CuePoint *)0x0) {
            return false;
          }
          lVar4 = CuePoint::GetTime(*ppCVar6,this->m_pSegment);
          if (lVar4 <= time_ns) {
            jj = ppCVar6 + 1;
            ppCVar6 = k;
          }
          k = ppCVar6;
        } while (jj <= k);
        this_local._7_1_ = false;
      }
      else {
        pTVar5 = CuePoint::Find(*pCP,pTrack);
        *pTP = pTVar5;
        this_local._7_1_ = *pTP != (TrackPosition *)0x0;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Cues::Find(long long time_ns, const Track* pTrack, const CuePoint*& pCP,
                const CuePoint::TrackPosition*& pTP) const {
  if (time_ns < 0 || pTrack == NULL || m_cue_points == NULL || m_count == 0)
    return false;

  CuePoint** const ii = m_cue_points;
  CuePoint** i = ii;

  CuePoint** const jj = ii + m_count;
  CuePoint** j = jj;

  pCP = *i;
  if (pCP == NULL)
    return false;

  if (time_ns <= pCP->GetTime(m_pSegment)) {
    pTP = pCP->Find(pTrack);
    return (pTP != NULL);
  }

  while (i < j) {
    // INVARIANT:
    //[ii, i) <= time_ns
    //[i, j)  ?
    //[j, jj) > time_ns

    CuePoint** const k = i + (j - i) / 2;
    if (k >= jj)
      return false;

    CuePoint* const pCP = *k;
    if (pCP == NULL)
      return false;

    const long long t = pCP->GetTime(m_pSegment);

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    if (i > j)
      return false;
  }

  if (i != j || i > jj || i <= ii)
    return false;

  pCP = *--i;

  if (pCP == NULL || pCP->GetTime(m_pSegment) > time_ns)
    return false;

  // TODO: here and elsewhere, it's probably not correct to search
  // for the cue point with this time, and then search for a matching
  // track.  In principle, the matching track could be on some earlier
  // cue point, and with our current algorithm, we'd miss it.  To make
  // this bullet-proof, we'd need to create a secondary structure,
  // with a list of cue points that apply to a track, and then search
  // that track-based structure for a matching cue point.

  pTP = pCP->Find(pTrack);
  return (pTP != NULL);
}